

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_buffer_manager.cpp
# Opt level: O3

void __thiscall duckdb::CSVBufferManager::ResetBuffer(CSVBufferManager *this,idx_t buffer_idx)

{
  vector<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_true> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int iVar2;
  ulong uVar3;
  reference pvVar4;
  CSVBuffer *pCVar5;
  _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  **pp_Var6;
  iterator iVar7;
  __hashtable *__h;
  __node_gen_type __node_gen;
  _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_30;
  _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_28;
  
  local_28 = (_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)buffer_idx;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->main_mutex);
  if (iVar2 != 0) {
    ::std::__throw_system_error(iVar2);
  }
  uVar3 = (long)(this->cached_buffers).
                super_vector<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_std::allocator<duckdb::shared_ptr<duckdb::CSVBuffer,_true>_>_>
                .
                super__Vector_base<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_std::allocator<duckdb::shared_ptr<duckdb::CSVBuffer,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->cached_buffers).
                super_vector<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_std::allocator<duckdb::shared_ptr<duckdb::CSVBuffer,_true>_>_>
                .
                super__Vector_base<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_std::allocator<duckdb::shared_ptr<duckdb::CSVBuffer,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4;
  if (buffer_idx < uVar3) {
    this_00 = &this->cached_buffers;
    if (buffer_idx == 0) {
      if (1 < uVar3) {
        pvVar4 = vector<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_true>::operator[](this_00,0);
        p_Var1 = (pvVar4->internal).
                 super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
        (pvVar4->internal).super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)0x0;
        (pvVar4->internal).super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
        }
        pp_Var6 = &local_28;
        while( true ) {
          local_30 = *pp_Var6 + 1;
          iVar7 = ::std::
                  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::find(&(this->reset_when_possible)._M_h,(key_type *)&local_30);
          if (iVar7.super__Node_iterator_base<unsigned_long,_false>._M_cur == (__node_type *)0x0)
          break;
          pvVar4 = vector<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_true>::operator[]
                             (this_00,(size_type)local_30);
          p_Var1 = (pvVar4->internal).
                   super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          (pvVar4->internal).super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)0x0;
          (pvVar4->internal).super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
          }
          ::std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::_M_erase(&(this->reset_when_possible)._M_h,&local_30);
          pp_Var6 = &local_30;
        }
        goto LAB_00b7dd1f;
      }
    }
    else {
      pvVar4 = vector<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_true>::operator[]
                         (this_00,buffer_idx - 1);
      if ((pvVar4->internal).super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr == (element_type *)0x0) {
        pvVar4 = vector<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_true>::operator[]
                           (this_00,buffer_idx);
        pCVar5 = shared_ptr<duckdb::CSVBuffer,_true>::operator->(pvVar4);
        if (pCVar5->last_buffer == true) {
          ::std::
          vector<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_std::allocator<duckdb::shared_ptr<duckdb::CSVBuffer,_true>_>_>
          ::clear(&this_00->
                   super_vector<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_std::allocator<duckdb::shared_ptr<duckdb::CSVBuffer,_true>_>_>
                 );
          ::std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::clear(&(this->reset_when_possible)._M_h);
        }
        else {
          pvVar4 = vector<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_true>::operator[]
                             (this_00,buffer_idx);
          p_Var1 = (pvVar4->internal).
                   super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          (pvVar4->internal).super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)0x0;
          (pvVar4->internal).super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
          }
          pp_Var6 = &local_28;
          while( true ) {
            local_30 = *pp_Var6 + 1;
            iVar7 = ::std::
                    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    ::find(&(this->reset_when_possible)._M_h,(key_type *)&local_30);
            if (iVar7.super__Node_iterator_base<unsigned_long,_false>._M_cur == (__node_type *)0x0)
            break;
            pvVar4 = vector<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_true>::operator[]
                               (this_00,(size_type)local_30);
            p_Var1 = (pvVar4->internal).
                     super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
            (pvVar4->internal).super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
            (pvVar4->internal).super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
            }
            ::std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::_M_erase(&(this->reset_when_possible)._M_h,&local_30);
            pp_Var6 = &local_30;
          }
        }
        goto LAB_00b7dd1f;
      }
    }
    local_30 = (_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&this->reset_when_possible;
    ::std::
    _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
              (local_30,&local_28);
  }
LAB_00b7dd1f:
  pthread_mutex_unlock((pthread_mutex_t *)&this->main_mutex);
  return;
}

Assistant:

void CSVBufferManager::ResetBuffer(const idx_t buffer_idx) {
	lock_guard<mutex> parallel_lock(main_mutex);
	if (buffer_idx >= cached_buffers.size()) {
		// Nothing to reset
		return;
	}
	D_ASSERT(cached_buffers[buffer_idx]);
	if (buffer_idx == 0 && cached_buffers.size() > 1) {
		cached_buffers[buffer_idx].reset();
		idx_t cur_buffer = buffer_idx + 1;
		while (reset_when_possible.find(cur_buffer) != reset_when_possible.end()) {
			cached_buffers[cur_buffer].reset();
			reset_when_possible.erase(cur_buffer);
			cur_buffer++;
		}
		return;
	}
	// We only reset if previous one was also already reset
	if (buffer_idx > 0 && !cached_buffers[buffer_idx - 1]) {
		if (cached_buffers[buffer_idx]->last_buffer) {
			// We clear the whole shebang
			cached_buffers.clear();
			reset_when_possible.clear();
			return;
		}
		cached_buffers[buffer_idx].reset();
		idx_t cur_buffer = buffer_idx + 1;
		while (reset_when_possible.find(cur_buffer) != reset_when_possible.end()) {
			cached_buffers[cur_buffer].reset();
			reset_when_possible.erase(cur_buffer);
			cur_buffer++;
		}
	} else {
		reset_when_possible.insert(buffer_idx);
	}
}